

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * cargo_strndup(char *s,size_t n)

{
  size_t local_30;
  size_t len;
  char *res;
  size_t n_local;
  char *s_local;
  
  local_30 = strlen(s);
  if (n < local_30) {
    local_30 = n;
  }
  s_local = (char *)_cargo_malloc(local_30 + 1);
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    s_local[local_30] = '\0';
    memcpy(s_local,s,local_30);
  }
  return s_local;
}

Assistant:

char *cargo_strndup(const char *s, size_t n)
{
    char *res;
    size_t len = strlen(s);

    if (n < len)
    {
        len = n;
    }

    if (!(res = (char *)_cargo_malloc(len + 1)))
    {
        return NULL;
    }

    res[len] = '\0';
    return (char *)memcpy(res, s, len);
}